

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void selfguided_restoration_fast_internal
               (int32_t *dgd,int width,int height,int dgd_stride,int32_t *dst,int dst_stride,
               int bit_depth,int sgr_params_idx,int radius_idx)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000010;
  int in_stack_00000018;
  int32_t v_1;
  int32_t b_1;
  int32_t a_1;
  int nb_1;
  int m_1;
  int l_1;
  int k_1;
  int32_t v;
  int32_t b;
  int32_t a;
  int nb;
  int m;
  int l;
  int k;
  int j;
  int i;
  int32_t *B;
  int32_t *A;
  int32_t B_ [8100];
  int32_t A_ [8100];
  int buf_stride;
  int width_ext;
  int r;
  sgr_params_type *params;
  int in_stack_ffffffffffff027c;
  int in_stack_ffffffffffff0280;
  int iVar4;
  int in_stack_ffffffffffff0284;
  uint uVar5;
  undefined1 *puVar6;
  int32_t *dgd_00;
  undefined1 local_fd68 [8];
  int in_stack_ffffffffffff02a0;
  int in_stack_ffffffffffff02a8;
  int32_t *in_stack_ffffffffffff02b0;
  int32_t *in_stack_ffffffffffff02b8;
  int32_t local_7ed8 [8103];
  int local_3c;
  int local_38;
  int local_34;
  sgr_params_type *local_30;
  int local_24;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_30 = av1_sgr_params + in_stack_00000010;
  local_34 = local_30->r[in_stack_00000018];
  local_38 = in_ESI + 6;
  local_3c = (in_ESI + 9U & 0xfffffffc) + 0x10;
  dgd_00 = local_7ed8;
  puVar6 = local_fd68;
  local_24 = in_R9D;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  calculate_intermediate_result
            (dgd_00,(int)((ulong)puVar6 >> 0x20),(int)puVar6,in_stack_ffffffffffff0284,
             in_stack_ffffffffffff0280,in_stack_ffffffffffff027c,in_stack_ffffffffffff02a0,
             in_stack_ffffffffffff02a8,in_stack_ffffffffffff02b0,in_stack_ffffffffffff02b8);
  iVar2 = local_3c * 3 + 3;
  iVar3 = local_3c * 3 + 3;
  for (uVar5 = 0; (int)uVar5 < local_10; uVar5 = uVar5 + 1) {
    if ((uVar5 & 1) == 0) {
      for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
        iVar1 = uVar5 * local_3c + iVar4;
        *(int32_t *)(local_20 + (long)(int)(uVar5 * local_24 + iVar4) * 4) =
             ((dgd_00[(long)iVar2 + (long)(iVar1 - local_3c)] +
              dgd_00[(long)iVar2 + (long)(iVar1 + local_3c)]) * 6 +
             (dgd_00[(long)iVar2 + (long)((iVar1 + -1) - local_3c)] +
              dgd_00[(long)iVar2 + (long)(iVar1 + -1 + local_3c)] +
              dgd_00[(long)iVar2 + (long)((iVar1 + 1) - local_3c)] +
             dgd_00[(long)iVar2 + (long)(iVar1 + 1 + local_3c)]) * 5) *
             *(int *)(local_8 + (long)(int)(uVar5 * local_14 + iVar4) * 4) +
             (*(int *)(puVar6 + (long)(iVar1 - local_3c) * 4 + (long)iVar3 * 4) +
             *(int *)(puVar6 + (long)(iVar1 + local_3c) * 4 + (long)iVar3 * 4)) * 6 +
             (*(int *)(puVar6 + (long)((iVar1 + -1) - local_3c) * 4 + (long)iVar3 * 4) +
              *(int *)(puVar6 + (long)(iVar1 + -1 + local_3c) * 4 + (long)iVar3 * 4) +
              *(int *)(puVar6 + (long)((iVar1 + 1) - local_3c) * 4 + (long)iVar3 * 4) +
             *(int *)(puVar6 + (long)(iVar1 + 1 + local_3c) * 4 + (long)iVar3 * 4)) * 5 + 0x100 >> 9
        ;
      }
    }
    else {
      for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
        iVar1 = uVar5 * local_3c + iVar4;
        *(int32_t *)(local_20 + (long)(int)(uVar5 * local_24 + iVar4) * 4) =
             (dgd_00[(long)iVar2 + (long)iVar1] * 6 +
             (dgd_00[(long)iVar2 + (long)(iVar1 + -1)] + dgd_00[(long)iVar2 + (long)(iVar1 + 1)]) *
             5) * *(int *)(local_8 + (long)(int)(uVar5 * local_14 + iVar4) * 4) +
             *(int *)(puVar6 + (long)iVar1 * 4 + (long)iVar3 * 4) * 6 +
             (*(int *)(puVar6 + (long)(iVar1 + -1) * 4 + (long)iVar3 * 4) +
             *(int *)(puVar6 + (long)(iVar1 + 1) * 4 + (long)iVar3 * 4)) * 5 + 0x80 >> 8;
      }
    }
  }
  return;
}

Assistant:

static void selfguided_restoration_fast_internal(
    int32_t *dgd, int width, int height, int dgd_stride, int32_t *dst,
    int dst_stride, int bit_depth, int sgr_params_idx, int radius_idx) {
  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  const int r = params->r[radius_idx];
  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes, for consistency
  // with the SIMD version of this function.
  int buf_stride = ((width_ext + 3) & ~3) + 16;
  int32_t A_[RESTORATION_PROC_UNIT_PELS];
  int32_t B_[RESTORATION_PROC_UNIT_PELS];
  int32_t *A = A_;
  int32_t *B = B_;
  int i, j;
  calculate_intermediate_result(dgd, width, height, dgd_stride, bit_depth,
                                sgr_params_idx, radius_idx, 1, A, B);
  A += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;
  B += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;

  // Use the A[] and B[] arrays to calculate the filtered image
  (void)r;
  assert(r == 2);
  for (i = 0; i < height; ++i) {
    if (!(i & 1)) {  // even row
      for (j = 0; j < width; ++j) {
        const int k = i * buf_stride + j;
        const int l = i * dgd_stride + j;
        const int m = i * dst_stride + j;
        const int nb = 5;
        const int32_t a = (A[k - buf_stride] + A[k + buf_stride]) * 6 +
                          (A[k - 1 - buf_stride] + A[k - 1 + buf_stride] +
                           A[k + 1 - buf_stride] + A[k + 1 + buf_stride]) *
                              5;
        const int32_t b = (B[k - buf_stride] + B[k + buf_stride]) * 6 +
                          (B[k - 1 - buf_stride] + B[k - 1 + buf_stride] +
                           B[k + 1 - buf_stride] + B[k + 1 + buf_stride]) *
                              5;
        const int32_t v = a * dgd[l] + b;
        dst[m] =
            ROUND_POWER_OF_TWO(v, SGRPROJ_SGR_BITS + nb - SGRPROJ_RST_BITS);
      }
    } else {  // odd row
      for (j = 0; j < width; ++j) {
        const int k = i * buf_stride + j;
        const int l = i * dgd_stride + j;
        const int m = i * dst_stride + j;
        const int nb = 4;
        const int32_t a = A[k] * 6 + (A[k - 1] + A[k + 1]) * 5;
        const int32_t b = B[k] * 6 + (B[k - 1] + B[k + 1]) * 5;
        const int32_t v = a * dgd[l] + b;
        dst[m] =
            ROUND_POWER_OF_TWO(v, SGRPROJ_SGR_BITS + nb - SGRPROJ_RST_BITS);
      }
    }
  }
}